

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O3

void __thiscall
RealTrafficConnection::ProcessCloudLayer(RealTrafficConnection *this,JSON_Object *pCL,size_t i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (pCL != (JSON_Object *)0x0) {
    dVar1 = jog_n_nan(pCL,"cover");
    dVar2 = jog_n_nan(pCL,"base");
    dVar3 = jog_n_nan(pCL,"tops");
    dVar4 = jog_n_nan(pCL,"type");
    dVar5 = jog_n_nan(pCL,"confidence");
    if (!NAN((float)dVar1) && !NAN((float)dVar2)) {
      if ((!NAN((float)dVar4) && !NAN((float)dVar3)) && (!NAN((float)dVar5))) {
        (this->rtWx).w.cloud_type._M_elems[i] = (float)dVar4;
        (this->rtWx).w.cloud_coverage_percent._M_elems[i] = (float)dVar1 / 100.0;
        (this->rtWx).w.cloud_base_msl_m._M_elems[i] = (float)dVar2;
        (this->rtWx).w.cloud_tops_msl_m._M_elems[i] = (float)dVar3;
      }
    }
  }
  return;
}

Assistant:

void RealTrafficConnection::ProcessCloudLayer(const JSON_Object* pCL, size_t i)
{
    if (!pCL) return;
    const float cover = (float) jog_n_nan(pCL, "cover");
    const float base  = (float) jog_n_nan(pCL, "base");
    const float tops  = (float) jog_n_nan(pCL, "tops");
    const float type  = (float) jog_n_nan(pCL, "type");
    const float conf  = (float) jog_n_nan(pCL, "confidence");
    if (std::isnan(cover) || std::isnan(base) || std::isnan(tops) || std::isnan(type) || std::isnan(conf))
        return;
    
    rtWx.w.cloud_type[i]             = type;
    rtWx.w.cloud_coverage_percent[i] = cover/100.0f;
    rtWx.w.cloud_base_msl_m[i]       = base;
    rtWx.w.cloud_tops_msl_m[i]       = tops;
}